

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabItemBackground(ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImU32 col)

{
  ImRect *pIVar1;
  ImU32 col_00;
  float rhs;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  float local_38;
  float local_34;
  float y2;
  float y1;
  float rounding;
  float width;
  ImGuiContext *g;
  ImU32 col_local;
  ImGuiTabItemFlags flags_local;
  ImRect *bb_local;
  ImDrawList *draw_list_local;
  
  _rounding = GImGui;
  g._0_4_ = col;
  g._4_4_ = flags;
  _col_local = bb;
  bb_local = (ImRect *)draw_list;
  y1 = ImRect::GetWidth(bb);
  if (0.0 < y1) {
    rhs = ImMin<float>((_rounding->Style).TabRounding,y1 * 0.5 + -1.0);
    y2 = ImMax<float>(0.0,rhs);
    pIVar1 = bb_local;
    local_34 = (_col_local->Min).y + 1.0;
    local_38 = (_col_local->Max).y - 1.0;
    ImVec2::ImVec2(&local_40,(_col_local->Min).x,local_38);
    ImDrawList::PathLineTo((ImDrawList *)pIVar1,&local_40);
    pIVar1 = bb_local;
    ImVec2::ImVec2(&local_48,(_col_local->Min).x + y2,local_34 + y2);
    ImDrawList::PathArcToFast((ImDrawList *)pIVar1,&local_48,y2,6,9);
    pIVar1 = bb_local;
    ImVec2::ImVec2(&local_50,(_col_local->Max).x - y2,local_34 + y2);
    ImDrawList::PathArcToFast((ImDrawList *)pIVar1,&local_50,y2,9,0xc);
    pIVar1 = bb_local;
    ImVec2::ImVec2(&local_58,(_col_local->Max).x,local_38);
    ImDrawList::PathLineTo((ImDrawList *)pIVar1,&local_58);
    ImDrawList::PathFillConvex((ImDrawList *)bb_local,(ImU32)g);
    pIVar1 = bb_local;
    if (0.0 < (_rounding->Style).TabBorderSize) {
      ImVec2::ImVec2(&local_60,(_col_local->Min).x + 0.5,local_38);
      ImDrawList::PathLineTo((ImDrawList *)pIVar1,&local_60);
      pIVar1 = bb_local;
      ImVec2::ImVec2(&local_68,(_col_local->Min).x + y2 + 0.5,local_34 + y2 + 0.5);
      ImDrawList::PathArcToFast((ImDrawList *)pIVar1,&local_68,y2,6,9);
      pIVar1 = bb_local;
      ImVec2::ImVec2(&local_70,((_col_local->Max).x - y2) - 0.5,local_34 + y2 + 0.5);
      ImDrawList::PathArcToFast((ImDrawList *)pIVar1,&local_70,y2,9,0xc);
      pIVar1 = bb_local;
      ImVec2::ImVec2(&local_78,(_col_local->Max).x - 0.5,local_38);
      ImDrawList::PathLineTo((ImDrawList *)pIVar1,&local_78);
      pIVar1 = bb_local;
      col_00 = GetColorU32(5,1.0);
      ImDrawList::PathStroke((ImDrawList *)pIVar1,col_00,false,(_rounding->Style).TabBorderSize);
    }
    return;
  }
  __assert_fail("width > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_widgets.cpp"
                ,0x1c8e,
                "void ImGui::TabItemBackground(ImDrawList *, const ImRect &, ImGuiTabItemFlags, ImU32)"
               );
}

Assistant:

void ImGui::TabItemBackground(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImU32 col)
{
    // While rendering tabs, we trim 1 pixel off the top of our bounding box so they can fit within a regular frame height while looking "detached" from it.
    ImGuiContext& g = *GImGui;
    const float width = bb.GetWidth();
    IM_UNUSED(flags);
    IM_ASSERT(width > 0.0f);
    const float rounding = ImMax(0.0f, ImMin(g.Style.TabRounding, width * 0.5f - 1.0f));
    const float y1 = bb.Min.y + 1.0f;
    const float y2 = bb.Max.y - 1.0f;
    draw_list->PathLineTo(ImVec2(bb.Min.x, y2));
    draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding, y1 + rounding), rounding, 6, 9);
    draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding, y1 + rounding), rounding, 9, 12);
    draw_list->PathLineTo(ImVec2(bb.Max.x, y2));
    draw_list->PathFillConvex(col);
    if (g.Style.TabBorderSize > 0.0f)
    {
        draw_list->PathLineTo(ImVec2(bb.Min.x + 0.5f, y2));
        draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding + 0.5f, y1 + rounding + 0.5f), rounding, 6, 9);
        draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding - 0.5f, y1 + rounding + 0.5f), rounding, 9, 12);
        draw_list->PathLineTo(ImVec2(bb.Max.x - 0.5f, y2));
        draw_list->PathStroke(GetColorU32(ImGuiCol_Border), false, g.Style.TabBorderSize);
    }
}